

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cxx::StaticInitializersForced(FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor;
  int local_1c;
  int i;
  FileDescriptor *file_local;
  
  bVar1 = HasDescriptorMethods(file);
  if ((!bVar1) && (iVar2 = FileDescriptor::extension_count(file), iVar2 < 1)) {
    local_1c = 0;
    while( true ) {
      iVar2 = FileDescriptor::message_type_count(file);
      if (iVar2 <= local_1c) {
        return false;
      }
      descriptor = FileDescriptor::message_type(file,local_1c);
      bVar1 = anon_unknown_0::HasExtension(descriptor);
      if (bVar1) break;
      local_1c = local_1c + 1;
    }
    return true;
  }
  return true;
}

Assistant:

bool StaticInitializersForced(const FileDescriptor* file) {
  if (HasDescriptorMethods(file) || file->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasExtension(file->message_type(i))) {
      return true;
    }
  }
  return false;
}